

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

size_t mz_file_read_func_stdio(void *pOpaque,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  int iVar1;
  mz_uint64 mVar2;
  size_t sVar3;
  
  mVar2 = ftello((FILE *)pOpaque);
  if ((long)file_ofs < 0) {
    return 0;
  }
  if ((mVar2 != file_ofs) && (iVar1 = fseeko((FILE *)pOpaque,file_ofs,0), iVar1 != 0)) {
    return 0;
  }
  sVar3 = fread(pBuf,1,n,(FILE *)pOpaque);
  return sVar3;
}

Assistant:

static size_t mz_file_read_func_stdio(void *pOpaque, mz_uint64 file_ofs,
                                      void *pBuf, size_t n) {
  MZ_FILE *pSrc_file = (MZ_FILE *)pOpaque;
  mz_int64 cur_ofs = MZ_FTELL64(pSrc_file);

  if (((mz_int64)file_ofs < 0) ||
      (((cur_ofs != (mz_int64)file_ofs)) &&
       (MZ_FSEEK64(pSrc_file, (mz_int64)file_ofs, SEEK_SET))))
    return 0;

  return MZ_FREAD(pBuf, 1, n, pSrc_file);
}